

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O2

void __thiscall
wavingz::demod::state_machine::symbol_sm::payload_t::process
          (payload_t *this,symbol_sm_t *ctx,optional<bool> *symbol)

{
  bool __x;
  size_t sVar1;
  pointer __p;
  reference_const_type pbVar2;
  pointer __p_00;
  reference local_30;
  __uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
  local_20;
  
  if ((symbol->super_type).m_initialized == false) {
    std::function<void_(unsigned_char_*,_unsigned_char_*)>::operator()
              (&ctx->callback,
               (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    __p_00 = (pointer)operator_new(0x10);
    __p_00->_vptr_state_base_t = (_func_int **)&PTR_process_00116c30;
    __p_00[1]._vptr_state_base_t = (_func_int **)0x0;
    local_20._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t_*,_false>.
    _M_head_impl = (tuple<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
                    )(_Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
                      )0x0;
    local_30._M_wp = (_WordT *)0x0;
    std::
    __uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    ::reset((__uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
             *)&ctx->current_state_m,__p_00);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
                   *)&local_30);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
    ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
                   *)&local_20);
  }
  else {
    pbVar2 = boost::optional<bool>::get(symbol);
    __x = *pbVar2;
    sVar1 = this->cnt;
    this->cnt = sVar1 + 1;
    local_30._M_bpos = (size_t)(7U - (int)sVar1 & 0x3f);
    local_30._M_wp = (_WordT *)&this->b;
    std::bitset<8UL>::reference::operator=(&local_30,__x);
    if (this->cnt == 8) {
      local_30._M_wp =
           (_WordT *)CONCAT71(local_30._M_wp._1_7_,(char)(this->b).super__Base_bitset<1UL>._M_w);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->payload,(uchar *)&local_30);
      (this->b).super__Base_bitset<1UL>._M_w = 0;
      this->cnt = 0;
    }
  }
  return;
}

Assistant:

void
payload_t::process(symbol_sm_t& ctx, const boost::optional<bool>& symbol)
{
    if (symbol == boost::none)
    {
        ctx.callback(payload.data(), payload.data() + payload.size());
        ctx.state(
            std::unique_ptr<start_of_frame_1_t>(new start_of_frame_1_t()));
    }
    else
    {
        b[7 - cnt++] = *symbol;
        if (cnt == b.size())
        {
            payload.push_back(uint8_t(b.to_ulong()));
            b.reset();
            cnt = 0;
        }
    }
}